

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-backend.cpp
# Opt level: O3

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,int n_tokens)

{
  ggml_tensor *pgVar1;
  ulong uVar2;
  ggml_cgraph *pgVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  allocator_type local_f9;
  undefined8 local_f8;
  ulong local_f0;
  int local_e8;
  float local_e4;
  ulong local_e0;
  long local_d8;
  long local_d0;
  float local_c4;
  ggml_cgraph *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  local_e0 = (ulong)(model->hparams).n_embd;
  local_f0 = (ulong)(uint)(model->hparams).n_layer;
  local_d8 = (long)(model->hparams).n_ctx;
  local_d0 = (long)(model->hparams).n_head;
  local_e8 = n_past;
  if ((gpt2_graph(gpt2_model_const&,int,int)::buf_size == '\0') &&
     (iVar4 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,int)::buf_size), iVar4 != 0)) {
    lVar10 = ggml_tensor_overhead();
    lVar11 = ggml_graph_overhead_custom(0x1000,0);
    gpt2_graph::buf_size = lVar11 + lVar10 * 0x1000;
    __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,int)::buf_size);
  }
  if ((gpt2_graph(gpt2_model_const&,int,int)::buf == '\0') &&
     (iVar4 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,int)::buf), iVar4 != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&gpt2_graph::buf,gpt2_graph::buf_size,&local_f9);
    __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                 &gpt2_graph::buf,&__dso_handle);
    __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,int)::buf);
  }
  local_48 = gpt2_graph::buf_size;
  puStack_40 = gpt2_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar5 = ggml_init();
  local_c0 = (ggml_cgraph *)ggml_new_graph_custom(uVar5,0x1000,0);
  lVar10 = (long)n_tokens;
  uVar6 = ggml_new_tensor_1d(uVar5,0x1a,lVar10);
  ggml_set_name(uVar6,"embd");
  ggml_set_input(uVar6);
  uVar7 = ggml_new_tensor_1d(uVar5,0x1a,lVar10);
  ggml_set_name(uVar7,"position");
  ggml_set_input(uVar7);
  uVar6 = ggml_get_rows(uVar5,model->wte,uVar6);
  uVar7 = ggml_get_rows(uVar5,model->wpe,uVar7);
  uVar6 = ggml_add(uVar5,uVar6,uVar7);
  if (0 < (int)local_f0) {
    local_70 = local_e0 * 4;
    local_78 = local_e0 * 8;
    iVar4 = (int)local_e0;
    local_90 = (long)(iVar4 * n_tokens);
    local_a0 = (long)(iVar4 * (n_tokens + local_e8));
    local_a8 = (long)(n_tokens + local_e8);
    local_e4 = (float)iVar4 / (float)(int)local_d0;
    local_b0 = (long)local_e8 * local_e0;
    local_80 = local_d8 * local_e0;
    local_88 = local_f0 * 0x60;
    local_f0 = 0;
    local_c4 = SQRT(local_e4);
    lVar11 = 0;
    local_b8 = 0;
    local_98 = lVar10;
    do {
      local_58 = uVar6;
      uVar6 = ggml_norm((model->hparams).eps,uVar5);
      uVar2 = local_f0;
      uVar6 = ggml_mul(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_1_g + local_f0));
      uVar6 = ggml_add(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_1_b + uVar2));
      uVar6 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_w
                                  + uVar2),uVar6);
      lVar8 = ggml_add(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_attn_attn_b + uVar2));
      uVar2 = local_e0;
      local_f8 = ggml_view_2d(uVar5,lVar8,local_e0,lVar10,*(undefined8 *)(lVar8 + 0x38),0);
      local_60 = ggml_view_2d(uVar5,lVar8,uVar2,lVar10,*(undefined8 *)(lVar8 + 0x38),local_70);
      uVar6 = ggml_view_2d(uVar5,lVar8,uVar2,lVar10,*(undefined8 *)(lVar8 + 0x38),local_78);
      local_50 = lVar11;
      if (0 < (int)lVar10) {
        pgVar1 = model->memory_k;
        local_68 = uVar6;
        lVar9 = ggml_element_size(pgVar1);
        lVar8 = local_90;
        lVar10 = local_b0;
        lVar11 = local_b8 * local_d8;
        uVar6 = ggml_view_1d(uVar5,pgVar1,local_90,lVar9 * local_b0);
        pgVar1 = model->memory_v;
        lVar9 = ggml_element_size(pgVar1);
        uVar7 = ggml_view_1d(uVar5,pgVar1,lVar8,lVar9 * lVar10);
        uVar6 = ggml_cpy(uVar5,local_60,uVar6);
        pgVar3 = local_c0;
        ggml_build_forward_expand(local_c0,uVar6);
        uVar6 = ggml_cpy(uVar5,local_68,uVar7);
        ggml_build_forward_expand(pgVar3,uVar6);
      }
      lVar10 = local_d0;
      uVar2 = local_e0;
      lVar9 = (long)(int)((long)((ulong)(uint)((int)local_e0 >> 0x1f) << 0x20 |
                                local_e0 & 0xffffffff) / (long)(int)local_d0);
      uVar6 = ggml_cont_3d(uVar5,local_f8,lVar9,local_d0,local_98);
      local_f8 = ggml_permute(uVar5,uVar6,0,2,1,3);
      pgVar1 = model->memory_k;
      lVar8 = ggml_element_size(pgVar1);
      uVar6 = ggml_view_1d(uVar5,pgVar1,local_a0,lVar8 * lVar11 * uVar2);
      uVar6 = ggml_reshape_3d(uVar5,uVar6,lVar9,lVar10,local_a8);
      uVar6 = ggml_permute(uVar5,uVar6,0,2,1,3);
      uVar6 = ggml_mul_mat(uVar5,uVar6,local_f8);
      fVar12 = local_c4;
      if (local_e4 < 0.0) {
        fVar12 = sqrtf(local_e4);
      }
      uVar6 = ggml_scale(1.0 / fVar12,uVar5,uVar6);
      uVar6 = ggml_diag_mask_inf(uVar5,uVar6,local_e8);
      local_f8 = ggml_soft_max(uVar5,uVar6);
      pgVar1 = model->memory_v;
      lVar10 = ggml_element_size(pgVar1);
      uVar6 = ggml_view_1d(uVar5,pgVar1,local_a0,lVar11 * uVar2 * lVar10);
      lVar11 = local_a8;
      lVar10 = local_d0;
      uVar6 = ggml_reshape_3d(uVar5,uVar6,lVar9,local_d0,local_a8);
      uVar6 = ggml_permute(uVar5,uVar6,1,2,0,3);
      uVar6 = ggml_cont_3d(uVar5,uVar6,lVar11,lVar9,lVar10);
      uVar6 = ggml_mul_mat(uVar5,uVar6,local_f8);
      uVar6 = ggml_permute(uVar5,uVar6,0,2,1);
      lVar10 = local_98;
      uVar6 = ggml_cont_2d(uVar5,uVar6,local_e0,local_98);
      uVar2 = local_f0;
      uVar6 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_w
                                  + local_f0),uVar6);
      uVar6 = ggml_add(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_attn_proj_b + uVar2));
      uVar6 = ggml_add(uVar5,uVar6,local_58);
      uVar7 = ggml_norm((model->hparams).eps,uVar5,uVar6);
      uVar7 = ggml_mul(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_2_g + uVar2));
      uVar7 = ggml_add(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_2_b + uVar2));
      uVar7 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                  uVar2),uVar7);
      uVar7 = ggml_add(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_mlp_fc_b + uVar2));
      uVar7 = ggml_gelu(uVar5,uVar7);
      uVar7 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((model->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w
                                  + uVar2),uVar7);
      uVar7 = ggml_add(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((model->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_mlp_proj_b + uVar2));
      uVar6 = ggml_add(uVar5,uVar7,uVar6);
      local_b8 = local_b8 + 1;
      lVar11 = local_50 + local_d8;
      local_b0 = local_b0 + local_80;
      local_f0 = uVar2 + 0x60;
    } while (local_88 != local_f0);
  }
  uVar6 = ggml_norm((model->hparams).eps,uVar5);
  uVar6 = ggml_mul(uVar5,uVar6,model->ln_f_g);
  uVar6 = ggml_add(uVar5,uVar6,model->ln_f_b);
  uVar6 = ggml_mul_mat(uVar5,model->lm_head,uVar6);
  ggml_set_name(uVar6,"logits");
  ggml_set_output(uVar6);
  pgVar3 = local_c0;
  ggml_build_forward_expand(local_c0,uVar6);
  ggml_free(uVar5);
  return pgVar3;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const int n_tokens) {
    const int N = n_tokens;

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, N);
    // at this point, the tensor data is not allocated yet and cannot be set
    // we will find the tensor after the graph is allocated by its name, and set the data then
    ggml_set_name(embd, "embd");
    // setting a tensor as an input will ensure that it is allocated at the beginning of the graph
    // this is important to ensure that the input tensors are not overwritten before they are used
    ggml_set_input(embd);

    struct ggml_tensor * position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, N);
    ggml_set_name(position, "position");
    ggml_set_input(position);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled =
                ggml_scale(ctx,
                        KQ,
                        1.0f/sqrtf(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_set_name(inpL, "logits");
    // setting a tensor as the output will ensure that it is not overwritten by subsequent operations
    ggml_set_output(inpL);

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}